

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_imagemagick_external
          (CImg<unsigned_char> *this,char *filename)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  CImg<char> *pCVar5;
  char *pcVar6;
  char *pcVar7;
  FILE *pFVar8;
  CImgArgumentException *this_00;
  CImgIOException *pCVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  char cVar14;
  char cVar15;
  char *pcVar16;
  CImg<char> local_b0;
  CImg<char> filename_tmp;
  CImg<char> command;
  CImg<char> s_filename;
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar16 = "non-";
    if (this->_is_shared != false) {
      pcVar16 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_imagemagick_external(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar16,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  if ((*filename != '-') || ((pFVar8 = _stdin, filename[1] != '.' && (filename[1] != '\0')))) {
    pFVar8 = fopen(filename,"rb");
  }
  if (pFVar8 == (FILE *)0x0) {
    pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgIOException::CImgIOException
              (pCVar9,"cimg::fopen(): Failed to open file \'%s\' with mode \'%s\'.",filename,"rb");
    __cxa_throw(pCVar9,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  fclose(pFVar8);
  CImg<char>::CImg(&command,0x400,1,1,1);
  CImg<char>::CImg(&filename_tmp,0x100,1,1,1);
  sVar4 = strlen(filename);
  CImg<char>::CImg(&local_b0,filename,(int)sVar4 + 1,1,1,1,false);
  pCVar5 = CImg<char>::_system_strescape(&local_b0);
  CImg<char>::CImg(&s_filename,pCVar5);
  if ((local_b0._is_shared == false) && (local_b0._data != (char *)0x0)) {
    operator_delete__(local_b0._data);
  }
  pcVar16 = command._data;
  uVar11 = (ulong)command._width;
  pcVar6 = cimg::imagemagick_path((char *)0x0,false);
  pcVar13 = filename;
  do {
    pcVar12 = pcVar13;
    pcVar7 = strchr(pcVar12,0x2e);
    pcVar13 = pcVar7 + 1;
  } while (filename <= pcVar7 + 1);
  if (pcVar12 == filename) {
    sVar4 = strlen(filename);
    pcVar12 = filename + sVar4;
  }
  sVar4 = strlen(pcVar12);
  iVar2 = (int)sVar4;
  iVar3 = 3;
  if (iVar2 < 3) {
    iVar3 = iVar2;
  }
  if ((iVar3 != -1) && (-1 < iVar2)) {
    iVar3 = 3;
    if (iVar2 < 3) {
      iVar3 = iVar2;
    }
    lVar10 = 0;
    do {
      cVar1 = pcVar12[lVar10];
      cVar14 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar14 = cVar1;
      }
      cVar1 = "pdf"[lVar10];
      cVar15 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar15 = cVar1;
      }
      if (cVar14 != cVar15) {
        iVar3 = 3;
        if (iVar2 < 3) {
          iVar3 = iVar2;
        }
        if ((-1 < iVar2) && (iVar3 + 1 != (int)lVar10)) {
          pcVar13 = "";
          goto LAB_00142e86;
        }
        break;
      }
      lVar10 = lVar10 + 1;
    } while (iVar3 + 1 != (int)lVar10);
  }
  pcVar13 = " -density 400x400";
LAB_00142e86:
  snprintf(pcVar16,uVar11,"%s%s \"%s\" pnm:-",pcVar6,pcVar13,s_filename._data);
  pFVar8 = popen(command._data,"r");
  if (pFVar8 == (FILE *)0x0) {
    while( true ) {
      pcVar16 = filename_tmp._data;
      uVar11 = (ulong)filename_tmp._width;
      pcVar13 = cimg::temporary_path((char *)0x0,false);
      pcVar6 = cimg::filenamerand();
      snprintf(pcVar16,uVar11,"%s%c%s.pnm",pcVar13,0x2f,pcVar6);
      pFVar8 = fopen(filename_tmp._data,"rb");
      pcVar16 = command._data;
      if (pFVar8 == (FILE *)0x0) break;
      if (((_stdin != pFVar8) && (_stdout != pFVar8)) && (iVar3 = fclose(pFVar8), iVar3 != 0)) {
        cimg::warn("cimg::fclose(): Error code %d returned during file closing.");
      }
    }
    pcVar6 = cimg::imagemagick_path((char *)0x0,false);
    pcVar13 = filename;
    do {
      pcVar12 = pcVar13;
      pcVar7 = strchr(pcVar12,0x2e);
      pcVar13 = pcVar7 + 1;
    } while (filename <= pcVar7 + 1);
    if (pcVar12 == filename) {
      sVar4 = strlen(filename);
      pcVar12 = filename + sVar4;
    }
    sVar4 = strlen(pcVar12);
    pcVar13 = s_filename._data;
    iVar2 = (int)sVar4;
    iVar3 = 3;
    if (iVar2 < 3) {
      iVar3 = iVar2;
    }
    if ((iVar3 != -1) && (-1 < iVar2)) {
      iVar3 = 3;
      if (iVar2 < 3) {
        iVar3 = iVar2;
      }
      lVar10 = 0;
      do {
        cVar1 = pcVar12[lVar10];
        cVar14 = cVar1 + ' ';
        if ((byte)(cVar1 + 0xa5U) < 0xe6) {
          cVar14 = cVar1;
        }
        cVar1 = "pdf"[lVar10];
        cVar15 = cVar1 + ' ';
        if ((byte)(cVar1 + 0xa5U) < 0xe6) {
          cVar15 = cVar1;
        }
        if (cVar14 != cVar15) {
          iVar3 = 3;
          if (iVar2 < 3) {
            iVar3 = iVar2;
          }
          if ((-1 < iVar2) && (iVar3 + 1 != (int)lVar10)) {
            pcVar12 = "";
            goto LAB_00143066;
          }
          break;
        }
        lVar10 = lVar10 + 1;
      } while (iVar3 + 1 != (int)lVar10);
    }
    pcVar12 = " -density 400x400";
LAB_00143066:
    CImg<char>::string(&local_b0,filename_tmp._data,true,false);
    pCVar5 = CImg<char>::_system_strescape(&local_b0);
    snprintf(pcVar16,(ulong)command._width,"%s%s \"%s\" \"%s\"",pcVar6,pcVar12,pcVar13,pCVar5->_data
            );
    if ((local_b0._is_shared == false) && (local_b0._data != (char *)0x0)) {
      operator_delete__(local_b0._data);
    }
    pcVar16 = command._data;
    cimg::imagemagick_path((char *)0x0,false);
    sVar4 = strlen(pcVar16);
    uVar11 = sVar4 & 0xffffffff;
    if (uVar11 != 0) {
      pcVar13 = (char *)operator_new__((ulong)((int)sVar4 + 0x10));
      strncpy(pcVar13,pcVar16,uVar11);
      builtin_strncpy(pcVar13 + uVar11," 2> /dev/null",0xe);
      system(pcVar13);
      operator_delete__(pcVar13);
    }
    pFVar8 = fopen(filename_tmp._data,"rb");
    if (pFVar8 == (FILE *)0x0) {
      pFVar8 = cimg::fopen(filename,"r");
      cimg::fclose(pFVar8);
      pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
      pcVar16 = "non-";
      if (this->_is_shared != false) {
        pcVar16 = "";
      }
      CImgIOException::CImgIOException
                (pCVar9,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_imagemagick_external(): Failed to load file \'%s\' with external command \'convert\'."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar16,"unsigned char",filename);
      __cxa_throw(pCVar9,&CImgIOException::typeinfo,CImgException::~CImgException);
    }
    if (((_stdin != pFVar8) && (_stdout != pFVar8)) && (iVar3 = fclose(pFVar8), iVar3 != 0)) {
      cimg::warn("cimg::fclose(): Error code %d returned during file closing.");
    }
    _load_pnm(this,(FILE *)0x0,filename_tmp._data);
    remove(filename_tmp._data);
  }
  else {
    cimg::_exception_mode(0,false);
    cimg::_exception_mode(0,true);
    _load_pnm(this,(FILE *)pFVar8,(char *)0x0);
    pclose(pFVar8);
  }
  if ((s_filename._is_shared == false) && (s_filename._data != (char *)0x0)) {
    operator_delete__(s_filename._data);
  }
  if ((filename_tmp._is_shared == false) && (filename_tmp._data != (char *)0x0)) {
    operator_delete__(filename_tmp._data);
  }
  if ((command._is_shared == false) && (command._data != (char *)0x0)) {
    operator_delete__(command._data);
  }
  return this;
}

Assistant:

CImg<T>& load_imagemagick_external(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_imagemagick_external(): Specified filename is (null).",
                                    cimg_instance);
      std::fclose(cimg::fopen(filename,"rb"));            // Check if file exists.
      CImg<charT> command(1024), filename_tmp(256);
      std::FILE *file = 0;
      const CImg<charT> s_filename = CImg<charT>::string(filename)._system_strescape();
#if cimg_OS==1
      cimg_snprintf(command,command._width,"%s%s \"%s\" pnm:-",
                    cimg::imagemagick_path(),
                    !cimg::strcasecmp(cimg::split_filename(filename),"pdf")?" -density 400x400":"",
                    s_filename.data());
      file = popen(command,"r");
      if (file) {
        const unsigned int omode = cimg::exception_mode();
        cimg::exception_mode(0);
        try { load_pnm(file); } catch (...) {
          pclose(file);
          cimg::exception_mode(omode);
          throw CImgIOException(_cimg_instance
                                "load_imagemagick_external(): Failed to load file '%s' with "
                                "external command 'convert'.",
                                cimg_instance,
                                filename);
        }
        pclose(file);
        return *this;
      }
#endif
      do {
        cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s.pnm",
                      cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        if ((file=std::fopen(filename_tmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(command,command._width,"%s%s \"%s\" \"%s\"",
                    cimg::imagemagick_path(),
                    !cimg::strcasecmp(cimg::split_filename(filename),"pdf")?" -density 400x400":"",
                    s_filename.data(),CImg<charT>::string(filename_tmp)._system_strescape().data());
      cimg::system(command,cimg::imagemagick_path());
      if (!(file = std::fopen(filename_tmp,"rb"))) {
        cimg::fclose(cimg::fopen(filename,"r"));
        throw CImgIOException(_cimg_instance
                              "load_imagemagick_external(): Failed to load file '%s' with external command 'convert'.",
                              cimg_instance,
                              filename);

      } else cimg::fclose(file);
      load_pnm(filename_tmp);
      std::remove(filename_tmp);
      return *this;
    }